

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int vcf_parse(kstring_t *s,bcf_hdr_t *h,bcf1_t *v)

{
  kstring_t *s_00;
  int32_t x;
  kh_vdict_t *pkVar1;
  undefined8 uVar2;
  double dVar3;
  kstring_t *s_01;
  size_t sVar4;
  khint_t kVar5;
  int iVar6;
  int iVar7;
  bcf_idpair_t *pbVar8;
  bcf_idpair_t *pbVar9;
  ulong uVar10;
  bcf_idpair_t *pbVar11;
  long lVar12;
  bcf_hrec_t *pbVar13;
  char *key;
  anon_union_4_2_947300a4 u;
  int *piVar14;
  bcf_idpair_t *pbVar15;
  uint32_t uVar16;
  uint uVar17;
  int *piVar18;
  bcf_hdr_t *pbVar19;
  int32_t *a;
  float *a_00;
  byte bVar20;
  bool bVar21;
  float fVar22;
  undefined1 auStack_118 [8];
  ks_tokaux_t aux;
  int local_dc;
  bcf_idpair_t *pbStack_d8;
  int l_2;
  kstring_t *local_d0;
  undefined1 auStack_c8 [8];
  int l;
  undefined4 uStack_bc;
  bcf_idpair_t *local_b8;
  bcf_idpair_t *pbStack_a8;
  kstring_t tmp;
  bcf_hrec_t **local_80;
  int *local_48;
  
  a_00 = (float *)auStack_118;
  bcf_clear(v);
  s_00 = &v->shared;
  aux.tab[3] = 0;
  aux.sep = 0;
  aux.finished = 0;
  aux.tab[1] = 0;
  aux.tab[2] = 0;
  auStack_118 = (undefined1  [8])0x0;
  aux.tab[0] = 0;
  local_d0 = s;
  pbVar8 = (bcf_idpair_t *)kstrtok(s->s,"\t",(ks_tokaux_t *)auStack_118);
  iVar7 = 0;
LAB_0011563e:
  s_01 = local_d0;
  uVar2 = aux._32_8_;
  if (pbVar8 == (bcf_idpair_t *)0x0) {
    return 0;
  }
  *(undefined1 *)aux._32_8_ = 0;
  iVar6 = aux.sep;
  switch(iVar7) {
  case 0:
    pkVar1 = (kh_vdict_t *)h->dict[1];
    *(undefined8 *)((long)a_00 + -8) = 0x115688;
    uVar17 = kh_get_vdict(pkVar1,(kh_cstr_t)pbVar8);
    if (uVar17 == pkVar1->n_buckets) {
      *(undefined8 *)((long)a_00 + -8) = 0x115d79;
      fprintf(_stderr,
              "[W::%s] contig \'%s\' is not defined in the header. (Quick workaround: index the file with tabix.)\n"
              ,"vcf_parse",pbVar8);
      pbStack_a8 = (bcf_idpair_t *)0x0;
      tmp.l = 0;
      tmp.m = 0;
      pbVar19 = (bcf_hdr_t *)&stack0xffffffffffffff58;
      *(undefined8 *)((long)a_00 + -8) = 0x115da7;
      ksprintf((kstring_t *)pbVar19,"##contig=<ID=%s>",pbVar8);
      sVar4 = tmp.m;
      *(undefined8 *)((long)a_00 + -8) = 0x115dba;
      pbVar13 = bcf_hdr_parse_line(pbVar19,(char *)sVar4,(int *)auStack_c8);
      sVar4 = tmp.m;
      *(undefined8 *)((long)a_00 + -8) = 0x115dc9;
      free((void *)sVar4);
      *(undefined8 *)((long)a_00 + -8) = 0x115dd4;
      iVar6 = bcf_hdr_add_hrec(h,pbVar13);
      if (iVar6 != 0) {
        *(undefined8 *)((long)a_00 + -8) = 0x115de0;
        bcf_hdr_sync(h);
      }
      *(undefined8 *)((long)a_00 + -8) = 0x115dec;
      uVar17 = kh_get_vdict(pkVar1,(kh_cstr_t)pbVar8);
      v->errcode = 1;
    }
    v->rid = pkVar1->vals[uVar17].id;
    break;
  case 1:
    *(undefined8 *)((long)a_00 + -8) = 0x115b37;
    iVar6 = atoi((char *)pbVar8);
    v->pos = iVar6 - 1;
    break;
  case 2:
    if ((*(char *)&pbVar8->key == '.') && (*(char *)((long)&pbVar8->key + 1) == '\0')) {
      *(undefined8 *)((long)a_00 + -8) = 7;
      uVar2 = *(undefined8 *)((long)a_00 + -8);
      *(undefined8 *)((long)a_00 + -8) = 0x115d3f;
      bcf_enc_size(s_00,0,(int)uVar2);
    }
    else {
      *(undefined8 *)((long)a_00 + -8) = 0x11572c;
      bcf_enc_vchar(s_00,iVar6 - (int)pbVar8,(char *)pbVar8);
    }
    break;
  case 3:
    iVar6 = iVar6 - (int)pbVar8;
    *(undefined8 *)((long)a_00 + -8) = 0x11573f;
    bcf_enc_vchar(s_00,iVar6,(char *)pbVar8);
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffff0000ffff | 0x10000;
    v->rlen = iVar6;
    break;
  case 4:
    if ((*(char *)&pbVar8->key != '.') || (*(char *)((long)&pbVar8->key + 1) != '\0')) {
      uVar10 = (ulong)pbVar8 & 0xffffffff;
      pbVar15 = pbVar8;
      do {
        pbVar9 = (bcf_idpair_t *)((long)&pbVar15->key + 1);
        if ((*(char *)&pbVar15->key == ',') || (*(char *)&pbVar15->key == '\0')) {
          *(undefined8 *)((long)a_00 + -8) = 0x1156d8;
          bcf_enc_vchar(s_00,(int)uVar10 - (int)pbVar8,(char *)pbVar8);
          *(ulong *)&v->field_0x10 =
               *(ulong *)&v->field_0x10 & 0xffffffff0000ffff |
               (ulong)((int)*(ulong *)&v->field_0x10 + 0x10000U & 0xffff0000);
          pbVar8 = pbVar9;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        bVar21 = pbVar15 != (bcf_idpair_t *)uVar2;
        pbVar15 = pbVar9;
      } while (bVar21);
    }
    break;
  case 5:
    if ((*(char *)&pbVar8->key != '.') ||
       (fVar22 = (float)bcf_float_missing, *(char *)((long)&pbVar8->key + 1) != '\0')) {
      *(undefined8 *)((long)a_00 + -8) = 0x115b5c;
      dVar3 = atof((char *)pbVar8);
      fVar22 = (float)dVar3;
    }
    v->qual = fVar22;
    if (v->max_unpack == 1) {
      return 0;
    }
    break;
  case 6:
    if ((*(char *)&pbVar8->key != '.') || (*(char *)((long)&pbVar8->key + 1) != '\0')) {
      pkVar1 = (kh_vdict_t *)h->dict[0];
      if (*(char *)(aux._32_8_ + -1) == ';') {
        *(undefined1 *)(aux._32_8_ + -1) = 0;
      }
      *(undefined8 *)((long)a_00 + -8) = 1;
      uVar10 = *(ulong *)((long)a_00 + -8);
      pbVar15 = pbVar8;
      do {
        if (*(char *)&pbVar15->key == ';') {
          uVar10 = (ulong)((int)uVar10 + 1);
        }
        else if (*(char *)&pbVar15->key == '\0') goto LAB_00115bbe;
        pbVar15 = (bcf_idpair_t *)((long)&pbVar15->key + 1);
      } while( true );
    }
    iVar6 = 0;
    a = (int32_t *)0x0;
    goto LAB_00115cf8;
  case 7:
    pkVar1 = (kh_vdict_t *)h->dict[0];
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffffff0000;
    if ((*(char *)&pbVar8->key != '.') || (*(char *)((long)&pbVar8->key + 1) != '\0')) {
      pbVar15 = pbVar8;
      if (*(char *)(aux._32_8_ + -1) == ';') {
        *(undefined1 *)(aux._32_8_ + -1) = 0;
      }
LAB_00115799:
      bVar20 = *(byte *)&pbVar15->key;
      if ((0x3d < (ulong)bVar20) || ((0x2800000000000001U >> ((ulong)bVar20 & 0x3f) & 1) == 0))
      goto LAB_00115b0d;
      *(char *)&pbVar15->key = '\0';
      if (bVar20 == 0x3d) {
        pbVar9 = (bcf_idpair_t *)((long)&pbVar15->key + 1);
        for (pbVar15 = pbVar9; (bVar20 = *(byte *)&pbVar15->key, bVar20 != 0 && (bVar20 != 0x3b));
            pbVar15 = (bcf_idpair_t *)((long)&pbVar15->key + 1)) {
        }
        *(char *)&pbVar15->key = '\0';
      }
      else {
        pbVar9 = (bcf_idpair_t *)0x0;
      }
      if (*(char *)&pbVar8->key != '\0') {
        pbStack_d8 = pbVar9;
        *(undefined8 *)((long)a_00 + -8) = 0x11580d;
        kVar5 = kh_get_vdict(pkVar1,(kh_cstr_t)pbVar8);
        if (kVar5 == pkVar1->n_buckets) {
LAB_0011595e:
          *(undefined8 *)((long)a_00 + -8) = 0x115984;
          fprintf(_stderr,"[W::%s] INFO \'%s\' is not defined in the header, assuming Type=String\n"
                  ,"vcf_parse",pbVar8);
          pbStack_a8 = (bcf_idpair_t *)0x0;
          tmp.l = 0;
          tmp.m = 0;
          pbVar19 = (bcf_hdr_t *)&stack0xffffffffffffff58;
          *(undefined8 *)((long)a_00 + -8) = 0x1159ae;
          ksprintf((kstring_t *)pbVar19,"##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">",
                   pbVar8);
          sVar4 = tmp.m;
          *(undefined8 *)((long)a_00 + -8) = 0x1159c1;
          pbVar13 = bcf_hdr_parse_line(pbVar19,(char *)sVar4,(int *)auStack_c8);
          sVar4 = tmp.m;
          *(undefined8 *)((long)a_00 + -8) = 0x1159d0;
          free((void *)sVar4);
          *(undefined8 *)((long)a_00 + -8) = 0x1159df;
          iVar6 = bcf_hdr_add_hrec(h,pbVar13);
          if (iVar6 != 0) {
            *(undefined8 *)((long)a_00 + -8) = 0x1159eb;
            bcf_hdr_sync(h);
          }
          *(undefined8 *)((long)a_00 + -8) = 0x1159f7;
          kVar5 = kh_get_vdict(pkVar1,(kh_cstr_t)pbVar8);
          v->errcode = 2;
          uVar10 = (ulong)kVar5;
          uVar16 = pkVar1->vals[uVar10].info[1];
        }
        else {
          uVar10 = (ulong)kVar5;
          uVar16 = pkVar1->vals[uVar10].info[1];
          if (uVar16 == 0xf) goto LAB_0011595e;
        }
        *(short *)&v->field_0x10 = *(short *)&v->field_0x10 + 1;
        x = pkVar1->vals[uVar10].id;
        *(undefined8 *)((long)a_00 + -8) = 0x11584d;
        bcf_enc_int1(s_00,x);
        pbVar9 = pbStack_d8;
        if (pbStack_d8 == (bcf_idpair_t *)0x0) {
          *(undefined8 *)((long)a_00 + -8) = 0x1158a0;
          bcf_enc_size(s_00,0,0);
        }
        else {
          uVar17 = uVar16 >> 4 & 0xf;
          if ((uVar17 != 3) && (uVar17 != 0)) {
            *(undefined8 *)((long)a_00 + -8) = 1;
            local_48 = (int *)(*(ulong *)((long)a_00 + -8) & 0xffffffff);
            pbVar11 = pbVar9;
            do {
              if (*(char *)&pbVar11->key == ',') {
                local_48 = (int *)(ulong)((int)local_48 + 1);
              }
              else if (*(char *)&pbVar11->key == '\0') goto LAB_001158c6;
              pbVar11 = (bcf_idpair_t *)((long)&pbVar11->key + 1);
            } while( true );
          }
          iVar6 = (int)pbStack_d8;
          *(undefined8 *)((long)a_00 + -8) = 0x11587d;
          bcf_enc_vchar(s_00,(int)pbVar15 - iVar6,(char *)pbVar9);
        }
        goto LAB_00115aff;
      }
      if (bVar20 != 0) goto LAB_00115b04;
    }
LAB_00115b15:
    if (v->max_unpack - 1U < 7) {
      return 0;
    }
    break;
  case 8:
    *(undefined8 *)((long)a_00 + -8) = 0x115e2e;
    iVar7 = _vcf_parse_format(s_01,h,v,(char *)pbVar8,(char *)uVar2);
    return iVar7;
  }
  goto switchD_00115670_default;
LAB_001158c6:
  if (uVar17 == 2) {
    a_00 = (float *)((long)a_00 + -((long)(int)local_48 * 4 + 0xfU & 0xfffffffffffffff0));
    piVar14 = (int *)0x0;
    if (0 < (int)local_48) {
      piVar14 = local_48;
    }
    for (piVar18 = (int *)0x0; piVar18 != piVar14; piVar18 = (int *)((long)piVar18 + 1)) {
      a_00[-2] = 1.593712e-39;
      a_00[-1] = 0.0;
      dVar3 = strtod((char *)pbVar9,(char **)&stack0xffffffffffffff58);
      a_00[(long)piVar18] = (float)dVar3;
      if (pbStack_a8 == pbVar9) {
        a_00[(long)piVar18] = (float)bcf_float_missing;
        for (; (*(char *)&pbStack_a8->key != '\0' && (*(char *)&pbStack_a8->key != ','));
            pbStack_a8 = (bcf_idpair_t *)((long)&pbStack_a8->key + 1)) {
        }
      }
      pbVar9 = (bcf_idpair_t *)((long)&pbStack_a8->key + 1);
    }
    a_00[-2] = 1.593827e-39;
    a_00[-1] = 0.0;
    bcf_enc_vfloat(s_00,(int)local_48,a_00);
  }
  else if (uVar17 == 1) {
    a_00 = (float *)((long)a_00 + -((long)(int)local_48 * 4 + 0xfU & 0xfffffffffffffff0));
    piVar14 = (int *)0x0;
    if (0 < (int)local_48) {
      piVar14 = local_48;
    }
    for (piVar18 = (int *)0x0; piVar18 != piVar14; piVar18 = (int *)((long)piVar18 + 1)) {
      ((int32_t *)a_00)[-2] = 10;
      ((int32_t *)a_00)[-1] = 0;
      uVar2 = *(undefined8 *)((int32_t *)a_00 + -2);
      ((int32_t *)a_00)[-2] = 0x115923;
      ((int32_t *)a_00)[-1] = 0;
      lVar12 = strtol((char *)pbVar9,(char **)&stack0xffffffffffffff58,(int)uVar2);
      ((int32_t *)a_00)[(long)piVar18] = (int32_t)lVar12;
      if (pbStack_a8 == pbVar9) {
        ((int32_t *)a_00)[(long)piVar18] = -0x80000000;
        for (; (*(char *)&pbStack_a8->key != '\0' && (*(char *)&pbStack_a8->key != ','));
            pbStack_a8 = (bcf_idpair_t *)((long)&pbStack_a8->key + 1)) {
        }
      }
      pbVar9 = (bcf_idpair_t *)((long)&pbStack_a8->key + 1);
    }
    ((int32_t *)a_00)[-2] = -1;
    ((int32_t *)a_00)[-1] = -1;
    uVar2 = *(undefined8 *)((int32_t *)a_00 + -2);
    ((int32_t *)a_00)[-2] = 0x115a34;
    ((int32_t *)a_00)[-1] = 0;
    bcf_enc_vint(s_00,(int)local_48,(int32_t *)a_00,(int)uVar2);
    ((int32_t *)a_00)[-2] = 0x115a44;
    ((int32_t *)a_00)[-1] = 0;
    iVar6 = strcmp((char *)pbVar8,"END");
    if (iVar6 == 0) {
      v->rlen = (int)*a_00 - v->pos;
    }
  }
LAB_00115aff:
  if (bVar20 == 0) goto LAB_00115b15;
LAB_00115b04:
  pbVar8 = (bcf_idpair_t *)((long)&pbVar15->key + 1);
LAB_00115b0d:
  pbVar15 = (bcf_idpair_t *)((long)&pbVar15->key + 1);
  goto LAB_00115799;
LAB_00115bbe:
  a = (int32_t *)((long)a_00 + -((long)(int)uVar10 * 4 + 0xfU & 0xfffffffffffffff0));
  a[-2] = 0x115be8;
  a[-1] = 0;
  key = kstrtok((char *)pbVar8,";",(ks_tokaux_t *)&stack0xffffffffffffff58);
  lVar12 = 0;
  while (key != (kh_cstr_t)0x0) {
    *(char *)local_80 = '\0';
    a[-2] = 0x115c09;
    a[-1] = 0;
    uVar17 = kh_get_vdict(pkVar1,key);
    if (uVar17 == pkVar1->n_buckets) {
      a[-2] = 0x115c5a;
      a[-1] = 0;
      fprintf(_stderr,"[W::%s] FILTER \'%s\' is not defined in the header\n","vcf_parse",key);
      auStack_c8._0_4_ = 0;
      auStack_c8._4_4_ = 0;
      l = 0;
      uStack_bc = 0;
      local_b8 = (bcf_idpair_t *)0x0;
      pbVar19 = (bcf_hdr_t *)auStack_c8;
      a[-2] = 0x115c84;
      a[-1] = 0;
      ksprintf((kstring_t *)pbVar19,"##FILTER=<ID=%s,Description=\"Dummy\">",key);
      pbVar8 = local_b8;
      a[-2] = 0x115c97;
      a[-1] = 0;
      pbVar13 = bcf_hdr_parse_line(pbVar19,(char *)pbVar8,&local_dc);
      pbVar8 = local_b8;
      a[-2] = 0x115ca7;
      a[-1] = 0;
      free(pbVar8);
      a[-2] = 0x115cb7;
      a[-1] = 0;
      iVar6 = bcf_hdr_add_hrec(h,pbVar13);
      if (iVar6 != 0) {
        a[-2] = 0x115cc3;
        a[-1] = 0;
        bcf_hdr_sync(h);
      }
      a[-2] = 0x115cce;
      a[-1] = 0;
      uVar17 = kh_get_vdict(pkVar1,key);
      v->errcode = 2;
    }
    a[lVar12] = pkVar1->vals[uVar17].id;
    lVar12 = lVar12 + 1;
    a[-2] = 0x115c33;
    a[-1] = 0;
    key = kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)&stack0xffffffffffffff58);
  }
  iVar6 = (int)lVar12;
  a_00 = (float *)a;
LAB_00115cf8:
  ((int32_t *)a_00)[-2] = -1;
  ((int32_t *)a_00)[-1] = -1;
  uVar2 = *(undefined8 *)((int32_t *)a_00 + -2);
  ((int32_t *)a_00)[-2] = 0x115d00;
  ((int32_t *)a_00)[-1] = 0;
  bcf_enc_vint(s_00,iVar6,a,(int)uVar2);
  if (v->max_unpack - 1U < 3) {
    return 0;
  }
switchD_00115670_default:
  *(undefined8 *)((long)a_00 + -8) = 0x115d25;
  pbVar8 = (bcf_idpair_t *)kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)auStack_118);
  iVar7 = iVar7 + 1;
  goto LAB_0011563e;
}

Assistant:

int vcf_parse(kstring_t *s, const bcf_hdr_t *h, bcf1_t *v)
{
    int i = 0;
    char *p, *q, *r, *t;
    kstring_t *str;
    khint_t k;
    ks_tokaux_t aux;

    bcf_clear1(v);
    str = &v->shared;
    memset(&aux, 0, sizeof(ks_tokaux_t));
    for (p = kstrtok(s->s, "\t", &aux), i = 0; p; p = kstrtok(0, 0, &aux), ++i) {
        q = (char*)aux.p;
        *q = 0;
        if (i == 0) { // CHROM
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
            k = kh_get(vdict, d, p);
            if (k == kh_end(d))
            {
                // Simple error recovery for chromosomes not defined in the header. It will not help when VCF header has
                // been already printed, but will enable tools like vcfcheck to proceed.
                fprintf(stderr, "[W::%s] contig '%s' is not defined in the header. (Quick workaround: index the file with tabix.)\n", __func__, p);
                kstring_t tmp = {0,0,0};
                int l;
                ksprintf(&tmp, "##contig=<ID=%s>", p);
                bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                free(tmp.s);
                if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                k = kh_get(vdict, d, p);
                v->errcode = BCF_ERR_CTG_UNDEF;
            }
            v->rid = kh_val(d, k).id;
        } else if (i == 1) { // POS
            v->pos = atoi(p) - 1;
        } else if (i == 2) { // ID
            if (strcmp(p, ".")) bcf_enc_vchar(str, q - p, p);
            else bcf_enc_size(str, 0, BCF_BT_CHAR);
        } else if (i == 3) { // REF
            bcf_enc_vchar(str, q - p, p);
            v->n_allele = 1, v->rlen = q - p;
        } else if (i == 4) { // ALT
            if (strcmp(p, ".")) {
                for (r = t = p;; ++r) {
                    if (*r == ',' || *r == 0) {
                        bcf_enc_vchar(str, r - t, t);
                        t = r + 1;
                        ++v->n_allele;
                    }
                    if (r == q) break;
                }
            }
        } else if (i == 5) { // QUAL
            if (strcmp(p, ".")) v->qual = atof(p);
            else memcpy(&v->qual, &bcf_float_missing, 4);
            if ( v->max_unpack && !(v->max_unpack>>1) ) return 0; // BCF_UN_STR
        } else if (i == 6) { // FILTER
            if (strcmp(p, ".")) {
                int32_t *a;
                int n_flt = 1, i;
                ks_tokaux_t aux1;
                vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
                // count the number of filters
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = p; *r; ++r)
                    if (*r == ';') ++n_flt;
                a = (int32_t*)alloca(n_flt * sizeof(int32_t));
                // add filters
                for (t = kstrtok(p, ";", &aux1), i = 0; t; t = kstrtok(0, 0, &aux1)) {
                    *(char*)aux1.p = 0;
                    k = kh_get(vdict, d, t);
                    if (k == kh_end(d))
                    {
                        // Simple error recovery for FILTERs not defined in the header. It will not help when VCF header has
                        // been already printed, but will enable tools like vcfcheck to proceed.
                        fprintf(stderr, "[W::%s] FILTER '%s' is not defined in the header\n", __func__, t);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##FILTER=<ID=%s,Description=\"Dummy\">", t);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, t);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    a[i++] = kh_val(d, k).id;
                }
                n_flt = i;
                bcf_enc_vint(str, n_flt, a, -1);
            } else bcf_enc_vint(str, 0, 0, -1);
            if ( v->max_unpack && !(v->max_unpack>>2) ) return 0;    // BCF_UN_FLT
        } else if (i == 7) { // INFO
            char *key;
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
            v->n_info = 0;
            if (strcmp(p, ".")) {
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = key = p;; ++r) {
                    int c;
                    char *val, *end;
                    if (*r != ';' && *r != '=' && *r != 0) continue;
                    val = end = 0;
                    c = *r; *r = 0;
                    if (c == '=') {
                        val = r + 1;
                        for (end = val; *end != ';' && *end != 0; ++end);
                        c = *end; *end = 0;
                    } else end = r;
                    if ( !*key ) { if (c==0) break; r = end; key = r + 1; continue; }  // faulty VCF, ";;" in the INFO
                    k = kh_get(vdict, d, key);
                    if (k == kh_end(d) || kh_val(d, k).info[BCF_HL_INFO] == 15)
                    {
                        fprintf(stderr, "[W::%s] INFO '%s' is not defined in the header, assuming Type=String\n", __func__, key);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">", key);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, key);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    uint32_t y = kh_val(d, k).info[BCF_HL_INFO];
                    ++v->n_info;
                    bcf_enc_int1(str, kh_val(d, k).id);
                    if (val == 0) {
                        bcf_enc_size(str, 0, BCF_BT_NULL);
                    } else if ((y>>4&0xf) == BCF_HT_FLAG || (y>>4&0xf) == BCF_HT_STR) { // if Flag has a value, treat it as a string
                        bcf_enc_vchar(str, end - val, val);
                    } else { // int/float value/array
                        int i, n_val;
                        char *t, *te;
                        for (t = val, n_val = 1; *t; ++t) // count the number of values
                            if (*t == ',') ++n_val;
                        if ((y>>4&0xf) == BCF_HT_INT) {
                            int32_t *z;
                            z = (int32_t*)alloca(n_val * sizeof(int32_t));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtol(t, &te, 10);
                                if ( te==t ) // conversion failed
                                {
                                    z[i] = bcf_int32_missing;
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vint(str, n_val, z, -1);
                            if (strcmp(key, "END") == 0) v->rlen = z[0] - v->pos;
                        } else if ((y>>4&0xf) == BCF_HT_REAL) {
                            float *z;
                            z = (float*)alloca(n_val * sizeof(float));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtod(t, &te);
                                if ( te==t ) // conversion failed
                                {
                                    bcf_float_set_missing(z[i]);
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vfloat(str, n_val, z);
                        }
                    }
                    if (c == 0) break;
                    r = end;
                    key = r + 1;
                }
            }
            if ( v->max_unpack && !(v->max_unpack>>3) ) return 0;
        } else if (i == 8) // FORMAT
            return _vcf_parse_format(s, h, v, p, q);
    }
    return 0;
}